

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

void __thiscall
StringifyTest_DedupeSubstrings_Test::TestBody(StringifyTest_DedupeSubstrings_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<wasm::SuffixTree::RepeatedSubstring> __l_01;
  bool bVar1;
  char *pcVar2;
  RepeatedSubstring *local_598;
  AssertHelper local_550;
  Message local_548;
  allocator<wasm::SuffixTree::RepeatedSubstring> local_53b;
  undefined1 local_53a;
  allocator<unsigned_int> local_539;
  uint local_538 [2];
  iterator local_530;
  size_type local_528;
  allocator<unsigned_int> local_519;
  uint local_518 [2];
  iterator local_510;
  size_type local_508;
  RepeatedSubstring *local_500;
  RepeatedSubstring local_4f8;
  undefined4 local_4d8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d0;
  iterator local_4b8;
  pointer local_4b0;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  local_4a8;
  undefined1 local_490 [8];
  AssertionResult gtest_ar;
  Substrings result;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  substrings;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashString;
  allocator<char> local_421;
  string local_420;
  undefined1 local_400 [8];
  Module wasm;
  StringifyTest_DedupeSubstrings_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)this;
  ::wasm::Module::Module((Module *)local_400);
  pcVar2 = dupModuleText;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,pcVar2,&local_421);
  PrintTest::parseWast(&this->super_StringifyTest,(Module *)local_400,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  hashStringifyModule((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &substrings.
                       super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)local_400);
  ::wasm::StringifyProcessor::repeatSubstrings
            ((vector *)
             &result.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::StringifyProcessor::dedupe((vector *)&gtest_ar.message_);
  local_53a = 1;
  local_500 = &local_4f8;
  local_4f8.Length = 4;
  local_518[0] = 0xc;
  local_518[1] = 0x1c;
  local_510 = local_518;
  local_508 = 2;
  std::allocator<unsigned_int>::allocator(&local_519);
  __l_00._M_len = local_508;
  __l_00._M_array = local_510;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_4f8.StartIndices,__l_00,&local_519);
  local_500 = (RepeatedSubstring *)local_4d8;
  local_4d8[0] = 3;
  local_538[0] = 0x17;
  local_538[1] = 0x22;
  local_530 = local_538;
  local_528 = 2;
  std::allocator<unsigned_int>::allocator(&local_539);
  __l._M_len = local_528;
  __l._M_array = local_530;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4d0,__l,&local_539);
  local_53a = 0;
  local_4b8 = &local_4f8;
  local_4b0 = (pointer)0x2;
  std::allocator<wasm::SuffixTree::RepeatedSubstring>::allocator(&local_53b);
  __l_01._M_len = (size_type)local_4b0;
  __l_01._M_array = local_4b8;
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector(&local_4a8,__l_01,&local_53b);
  testing::internal::EqHelper::
  Compare<std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>,_nullptr>
            ((EqHelper *)local_490,"result",
             "(std::vector<SuffixTree::RepeatedSubstring>{ SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})}, SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}})"
             ,(vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               *)&gtest_ar.message_,&local_4a8);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector(&local_4a8);
  std::allocator<wasm::SuffixTree::RepeatedSubstring>::~allocator(&local_53b);
  local_598 = (RepeatedSubstring *)&local_4b8;
  do {
    local_598 = local_598 + -1;
    ::wasm::SuffixTree::RepeatedSubstring::~RepeatedSubstring(local_598);
  } while (local_598 != &local_4f8);
  std::allocator<unsigned_int>::~allocator(&local_539);
  std::allocator<unsigned_int>::~allocator(&local_519);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/stringify.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&gtest_ar.message_);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&result.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &substrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::Module::~Module((Module *)local_400);
  return;
}

Assistant:

TEST_F(StringifyTest, DedupeSubstrings) {
  Module wasm;
  parseWast(wasm, dupModuleText);
  auto hashString = hashStringifyModule(&wasm);
  std::vector<SuffixTree::RepeatedSubstring> substrings =
    StringifyProcessor::repeatSubstrings(hashString);
  auto result = StringifyProcessor::dedupe(substrings);

  EXPECT_EQ(
    result,
    (std::vector<SuffixTree::RepeatedSubstring>{
      // 5, 6, 7, 6 appears at idx 12 and again at 28
      SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})},
      // 10, 11, 6 appears at idx 23 and again at 34
      SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}}));
}